

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O2

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint src_file_index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar4;
  mz_uint64 cur_file_ofs;
  undefined8 uVar5;
  mz_uint64 mVar6;
  mz_uint n;
  mz_bool mVar7;
  mz_zip_error mVar8;
  size_t sVar9;
  int *piVar10;
  size_t sVar11;
  short *psVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  short *__src;
  void *pvVar16;
  ulong uVar17;
  void *pvVar18;
  int *pCentral_dir_header;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  ulong local_590;
  ulong local_580;
  ulong local_578;
  void *local_568;
  uint local_55c;
  ulong local_558;
  ulong local_550;
  mz_zip_array local_548;
  ulong local_528;
  short *local_520;
  mz_zip_array local_518 [2];
  mz_uint32 local_header_u32 [8];
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined4 uStack_4a8;
  undefined4 local_4a4;
  undefined4 uStack_4a0;
  undefined2 uStack_49c;
  undefined2 local_49a;
  undefined6 uStack_498;
  undefined4 uStack_492;
  undefined4 uStack_48e;
  mz_zip_archive_file_stat src_file_stat;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (((((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
       (pSource_zip->m_pRead == (mz_file_read_func)0x0)) ||
      ((pmVar4 = pSource_zip->m_pState, pmVar4->m_zip64 != 0 && (pArray->m_zip64 == 0)))) ||
     ((pSource_zip->m_total_files <= src_file_index ||
      (pvVar16 = (pmVar4->m_central_dir).m_p, pvVar16 == (void *)0x0)))) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  pCentral_dir_header =
       (int *)((long)pvVar16 +
              (ulong)*(uint *)((long)(pmVar4->m_central_dir_offsets).m_p + (ulong)src_file_index * 4
                              ));
  if (*pCentral_dir_header != 0x2014b50) {
LAB_0010d130:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  local_558 = (ulong)*(ushort *)(pCentral_dir_header + 7);
  local_528 = (ulong)*(ushort *)(pCentral_dir_header + 8);
  local_550 = (ulong)*(ushort *)((long)pCentral_dir_header + 0x1e);
  uVar13 = (ulong)((uint)*(ushort *)(pCentral_dir_header + 8) +
                   (uint)*(ushort *)(pCentral_dir_header + 7) +
                  (uint)*(ushort *)((long)pCentral_dir_header + 0x1e));
  if (((pArray->m_central_dir).m_size + uVar13) - 0xffffffb1 < 0xffffffff00000001)
  goto LAB_0010ced1;
  n = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  if (pArray->m_zip64 == 0) {
    if (pZip->m_total_files == 0xffff) goto LAB_0010d148;
  }
  else if (pZip->m_total_files == 0xffffffff) {
LAB_0010d148:
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  mVar7 = mz_zip_file_stat_internal
                    (pSource_zip,src_file_index,(mz_uint8 *)pCentral_dir_header,&src_file_stat,
                     (mz_bool *)0x0);
  mVar6 = src_file_stat.m_local_header_ofs;
  if (mVar7 == 0) {
    return 0;
  }
  cur_file_ofs = pZip->m_archive_size;
  sVar9 = (*pSource_zip->m_pRead)
                    (pSource_zip->m_pIO_opaque,src_file_stat.m_local_header_ofs,local_header_u32,
                     0x1e);
  if (sVar9 != 0x1e) goto LAB_0010d5f2;
  if (local_header_u32[0] != 0x4034b50) goto LAB_0010d130;
  uVar20 = (ulong)(ushort)local_header_u32[7];
  uVar17 = ((uint)local_header_u32[6]._2_2_ + (uint)(ushort)local_header_u32[7]) +
           src_file_stat.m_comp_size;
  if (((ushort)local_header_u32[7] == 0) ||
     ((local_header_u32._18_4_ != -1 && (local_header_u32._22_4_ != -1)))) {
    bVar22 = false;
  }
  else {
    local_518[0].m_capacity = 0;
    local_518[0].m_p._0_4_ = 0;
    local_518[0].m_p._4_4_ = 0;
    local_518[0].m_size._0_4_ = 0;
    local_518[0].m_size._4_1_ = 0;
    local_518[0].m_size._5_1_ = 0;
    local_518[0].m_size._6_1_ = 0;
    local_518[0].m_size._7_1_ = 0;
    local_518[0].m_element_size = 1;
    local_518[0]._28_4_ = 0;
    mVar7 = mz_zip_array_ensure_capacity(pZip,local_518,uVar20,0);
    if (mVar7 == 0) {
      mVar8 = MZ_ZIP_ALLOC_FAILED;
LAB_0010d225:
      pZip->m_last_error = mVar8;
      return 0;
    }
    local_520 = (short *)CONCAT44(local_518[0].m_p._4_4_,local_518[0].m_p._0_4_);
    sVar9 = (*pSource_zip->m_pRead)
                      (pSource_zip->m_pIO_opaque,
                       local_header_u32[6]._2_2_ + src_file_stat.m_local_header_ofs + 0x1e,local_520
                       ,uVar20);
    if (sVar9 != uVar20) {
      mVar8 = MZ_ZIP_FILE_READ_FAILED;
LAB_0010d219:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_520);
      goto LAB_0010d225;
    }
    mVar8 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    psVar12 = local_520;
    do {
      uVar19 = (uint)uVar20;
      if (uVar19 < 4) goto LAB_0010d219;
      lVar21 = (ulong)(ushort)psVar12[1] + 4;
      uVar15 = (uint)lVar21;
      if (uVar19 < uVar15) goto LAB_0010d219;
      bVar22 = *psVar12 == 1;
      if (bVar22) {
        if ((ushort)psVar12[1] < 0x10) goto LAB_0010d219;
        break;
      }
      psVar12 = (short *)((long)psVar12 + lVar21);
      uVar19 = uVar19 - uVar15;
      uVar20 = (ulong)uVar19;
    } while (uVar19 != 0);
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_520);
  }
  if ((pArray->m_zip64 == 0) &&
     (0xfffffffe < (pArray->m_central_dir).m_size + uVar13 + n + cur_file_ofs + uVar17 + 0xb2)) {
    pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    return 0;
  }
  mVar7 = mz_zip_writer_write_zeros(pZip,cur_file_ofs,n);
  if (mVar7 == 0) {
    return 0;
  }
  uVar20 = cur_file_ofs + n;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & uVar20) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stricaud[P]faup/src/lib/miniz/miniz_zip.c"
                  ,0xfc5,
                  "mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *, mz_zip_archive *, mz_uint)"
                 );
  }
  sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar20,local_header_u32,0x1e);
  if (sVar9 != 0x1e) goto LAB_0010d902;
  uVar14 = 0x10000;
  if (uVar17 < 0x10000) {
    uVar14 = uVar17;
  }
  sVar9 = 0x20;
  if (0x20 < uVar14) {
    sVar9 = uVar14;
  }
  piVar10 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar9);
  if (piVar10 == (int *)0x0) goto LAB_0010d9aa;
  local_568 = (void *)(mVar6 + 0x1e);
  local_580 = uVar20 + 0x1e;
  sVar9 = uVar20;
  for (; uVar17 != 0; uVar17 = uVar17 - sVar9) {
    sVar9 = 0x10000;
    if (uVar17 < 0x10000) {
      sVar9 = uVar17;
    }
    sVar11 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(mz_uint64)local_568,piVar10,sVar9);
    if (sVar11 != sVar9) goto LAB_0010d5e7;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_580,piVar10,sVar9);
    if (sVar11 != sVar9) goto LAB_0010d8f7;
    local_568 = (void *)((long)local_568 + sVar9);
    local_580 = local_580 + sVar9;
  }
  local_55c = (uint)sVar9;
  if ((local_header_u32[1]._2_1_ & 8) != 0) {
    if ((bool)(~bVar22 & pSource_zip->m_pState->m_zip64 == 0)) {
      sVar9 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(mz_uint64)local_568,piVar10,0x10);
      if (sVar9 == 0x10) {
        if (pZip->m_pState->m_zip64 == 0) {
          local_55c = (uint)(*piVar10 == 0x8074b50) * 4 + 0xc;
        }
        else {
          uVar17 = (ulong)(*piVar10 == 0x8074b50);
          iVar1 = piVar10[uVar17];
          iVar2 = piVar10[uVar17 + 1];
          iVar3 = piVar10[uVar17 + 2];
          *piVar10 = 0x8074b50;
          *(char *)(piVar10 + 1) = (char)iVar1;
          *(char *)((long)piVar10 + 5) = (char)((uint)iVar1 >> 8);
          *(char *)((long)piVar10 + 6) = (char)((uint)iVar1 >> 0x10);
          *(char *)((long)piVar10 + 7) = (char)((uint)iVar1 >> 0x18);
          *(char *)(piVar10 + 2) = (char)iVar2;
          *(char *)((long)piVar10 + 9) = (char)((uint)iVar2 >> 8);
          *(char *)((long)piVar10 + 10) = (char)((uint)iVar2 >> 0x10);
          *(char *)((long)piVar10 + 0xb) = (char)((uint)iVar2 >> 0x18);
          piVar10[3] = 0;
          *(char *)(piVar10 + 4) = (char)iVar3;
          *(char *)((long)piVar10 + 0x11) = (char)((uint)iVar3 >> 8);
          *(char *)((long)piVar10 + 0x12) = (char)((uint)iVar3 >> 0x10);
          *(char *)((long)piVar10 + 0x13) = (char)((uint)iVar3 >> 0x18);
          piVar10[5] = 0;
          local_55c = 0x18;
        }
        goto LAB_0010d8ce;
      }
    }
    else {
      sVar9 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(mz_uint64)local_568,piVar10,0x18);
      if (sVar9 == 0x18) {
        local_55c = (uint)(*piVar10 == 0x8074b50) * 4 + 0x14;
LAB_0010d8ce:
        uVar17 = (ulong)local_55c;
        sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_580,piVar10,uVar17);
        if (sVar9 != uVar17) {
LAB_0010d8f7:
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar10);
LAB_0010d902:
          pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
          return 0;
        }
        local_580 = local_580 + uVar17;
        goto LAB_0010d240;
      }
    }
LAB_0010d5e7:
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar10);
LAB_0010d5f2:
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
LAB_0010d240:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar10);
  uVar17 = (pArray->m_central_dir).m_size;
  local_4b8 = *(undefined8 *)pCentral_dir_header;
  uStack_4b0 = *(undefined8 *)(pCentral_dir_header + 2);
  uVar5 = *(undefined8 *)(pCentral_dir_header + 6);
  uStack_498 = (undefined6)((ulong)*(undefined8 *)((long)pCentral_dir_header + 0x1e) >> 0x10);
  uStack_4a8 = (undefined4)*(undefined8 *)(pCentral_dir_header + 4);
  local_4a4 = (undefined4)((ulong)*(undefined8 *)(pCentral_dir_header + 4) >> 0x20);
  uStack_4a0 = (undefined4)uVar5;
  uStack_49c = (undefined2)((ulong)uVar5 >> 0x20);
  local_49a = (undefined2)((ulong)uVar5 >> 0x30);
  uStack_492 = (undefined4)*(undefined8 *)((long)pCentral_dir_header + 0x26);
  if (pArray->m_zip64 == 0) {
    if ((local_580 >> 0x20 != 0) || (0xfffffffe < uVar20)) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    _uStack_492 = CONCAT44((int)uVar20,uStack_492);
    uVar20 = uVar17 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar20) &&
       (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,1), mVar7 == 0))
    goto LAB_0010d9aa;
    (pArray->m_central_dir).m_size = uVar20;
    uVar20 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(uVar17 * uVar20 + (long)(pArray->m_central_dir).m_p),&local_4b8,uVar20 * 0x2e);
    sVar9 = (pArray->m_central_dir).m_size;
    uVar20 = uVar13 + sVar9;
    if ((uVar20 <= (pArray->m_central_dir).m_capacity) ||
       (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,1), mVar7 != 0)) {
      (pArray->m_central_dir).m_size = uVar20;
      if (uVar13 != 0) {
        uVar20 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(sVar9 * uVar20 + (long)(pArray->m_central_dir).m_p),
               (void *)((long)pCentral_dir_header + 0x2e),uVar13 * uVar20);
LAB_0010d87b:
        uVar20 = (pArray->m_central_dir).m_size;
      }
      if (0xfffffffe < uVar20) {
        if ((uVar17 <= (pArray->m_central_dir).m_capacity) ||
           (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar17,0), mVar7 != 0))
        {
          (pArray->m_central_dir).m_size = uVar17;
        }
LAB_0010ced1:
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
        return 0;
      }
      local_55c = (uint)uVar17;
      sVar9 = (pArray->m_central_dir_offsets).m_size;
      uVar13 = sVar9 + 1;
      if ((uVar13 <= (pArray->m_central_dir_offsets).m_capacity) ||
         (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar13,1),
         mVar7 != 0)) {
        (pArray->m_central_dir_offsets).m_size = uVar13;
        uVar13 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
        memcpy((void *)(sVar9 * uVar13 + (long)(pArray->m_central_dir_offsets).m_p),&local_55c,
               uVar13);
        pZip->m_total_files = pZip->m_total_files + 1;
        pZip->m_archive_size = local_580;
        return 1;
      }
    }
    if ((uVar17 <= (pArray->m_central_dir).m_capacity) ||
       (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar17,0), mVar7 != 0)) {
      (pArray->m_central_dir).m_size = uVar17;
    }
LAB_0010d9aa:
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return 0;
  }
  local_548.m_capacity = 0;
  local_548.m_p = (void *)0x0;
  local_548.m_size = 0;
  local_548._24_8_ = 1;
  local_4a4 = 0xffffffff;
  uStack_4a0 = 0xffffffff;
  _uStack_492 = CONCAT44(0xffffffff,uStack_492);
  mVar7 = mz_zip_array_ensure_capacity(pZip,&local_548,local_550 + 0x40,0);
  if (mVar7 == 0) {
LAB_0010d625:
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
LAB_0010d635:
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_548.m_p);
    return 0;
  }
  local_548.m_size = 0;
  local_518[0].m_p._4_4_ = (undefined4)src_file_stat.m_uncomp_size;
  local_518[0].m_size._0_4_ = (undefined4)(src_file_stat.m_uncomp_size >> 0x20);
  local_518[0].m_size._4_1_ = (undefined1)src_file_stat.m_comp_size;
  local_518[0].m_size._5_1_ = (undefined1)(src_file_stat.m_comp_size >> 8);
  local_518[0].m_size._6_1_ = (undefined1)(src_file_stat.m_comp_size >> 0x10);
  local_518[0].m_size._7_1_ = (undefined1)(src_file_stat.m_comp_size >> 0x18);
  local_518[0].m_capacity =
       CONCAT17((char)(uVar20 >> 0x18),
                CONCAT16((char)(uVar20 >> 0x10),
                         CONCAT15((char)(uVar20 >> 8),
                                  CONCAT14((char)uVar20,(int)(src_file_stat.m_comp_size >> 0x20)))))
  ;
  local_518[0].m_element_size = (mz_uint)(uVar20 >> 0x20);
  local_518[0].m_p._0_4_ = 0x180001;
  if ((local_548.m_capacity < 0x1c) &&
     (mVar7 = mz_zip_array_ensure_capacity(pZip,&local_548,0x1c,1), mVar7 == 0)) goto LAB_0010d625;
  psVar12 = (short *)((long)pCentral_dir_header + local_558 + 0x2e);
  local_548.m_size = 0x1c;
  local_568 = local_548.m_p;
  memcpy(local_548.m_p,local_518,(local_548._24_8_ & 0xffffffff) * 0x1c);
  if ((int)local_550 == 0) {
    uVar13 = 0x1c;
  }
  else {
    local_578 = 0x1c;
    local_590 = local_550 & 0xffffffff;
    __src = psVar12;
    do {
      if ((uint)local_590 < 4) {
LAB_0010d62e:
        pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
        goto LAB_0010d635;
      }
      lVar21 = (ulong)(ushort)__src[1] + 4;
      if ((uint)local_590 < (uint)lVar21) goto LAB_0010d62e;
      if (*__src != 1) {
        uVar13 = local_578 + lVar21;
        if (local_548.m_capacity < uVar13) {
          mVar7 = mz_zip_array_ensure_capacity(pZip,&local_548,uVar13,1);
          if (mVar7 == 0) goto LAB_0010d625;
          local_568 = local_548.m_p;
        }
        local_548.m_size = uVar13;
        memcpy((void *)(local_578 * (local_548._24_8_ & 0xffffffff) + (long)local_568),__src,
               (local_548._24_8_ & 0xffffffff) * lVar21);
        local_578 = uVar13;
      }
      __src = (short *)((long)__src + lVar21);
      uVar19 = (uint)local_590 - (uint)lVar21;
      local_590 = (ulong)uVar19;
      uVar13 = local_548.m_size;
    } while (uVar19 != 0);
  }
  local_49a = (undefined2)uVar13;
  sVar9 = (pArray->m_central_dir).m_size;
  uVar20 = sVar9 + 0x2e;
  if (((pArray->m_central_dir).m_capacity < uVar20) &&
     (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,1), mVar7 == 0)) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_548.m_p);
    goto LAB_0010d9e9;
  }
  (pArray->m_central_dir).m_size = uVar20;
  uVar20 = (ulong)(pArray->m_central_dir).m_element_size;
  memcpy((void *)(sVar9 * uVar20 + (long)(pArray->m_central_dir).m_p),&local_4b8,uVar20 * 0x2e);
  sVar9 = (pArray->m_central_dir).m_size;
  uVar20 = local_558 + sVar9;
  if (((pArray->m_central_dir).m_capacity < uVar20) &&
     (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,1), mVar7 == 0)) {
    pvVar18 = pZip->m_pAlloc_opaque;
    pvVar16 = local_548.m_p;
  }
  else {
    (pArray->m_central_dir).m_size = uVar20;
    if (local_558 != 0) {
      uVar20 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar9 * uVar20 + (long)(pArray->m_central_dir).m_p),
             (void *)((long)pCentral_dir_header + 0x2e),local_558 * uVar20);
      uVar20 = (pArray->m_central_dir).m_size;
    }
    pvVar16 = local_548.m_p;
    uVar14 = uVar13 + uVar20;
    if ((uVar14 <= (pArray->m_central_dir).m_capacity) ||
       (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar14,1), mVar7 != 0)) {
      (pArray->m_central_dir).m_size = uVar14;
      if (uVar13 != 0) {
        uVar14 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(uVar20 * uVar14 + (long)(pArray->m_central_dir).m_p),pvVar16,uVar13 * uVar14
              );
        uVar14 = (pArray->m_central_dir).m_size;
      }
      uVar13 = uVar14 + local_528;
      if ((uVar13 <= (pArray->m_central_dir).m_capacity) ||
         (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1), mVar7 != 0)) {
        (pArray->m_central_dir).m_size = uVar13;
        if (local_528 != 0) {
          uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
          memcpy((void *)(uVar14 * uVar13 + (long)(pArray->m_central_dir).m_p),
                 (void *)((long)psVar12 + local_550),local_528 * uVar13);
        }
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pvVar16);
        goto LAB_0010d87b;
      }
    }
    pvVar18 = pZip->m_pAlloc_opaque;
  }
  (*pZip->m_pFree)(pvVar18,pvVar16);
  if ((uVar17 <= (pArray->m_central_dir).m_capacity) ||
     (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar17,0), mVar7 != 0)) {
    (pArray->m_central_dir).m_size = uVar17;
  }
LAB_0010d9e9:
  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip, mz_zip_archive *pSource_zip, mz_uint src_file_index)
{
    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state *pState;
    void *pBuf;
    const mz_uint8 *pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the source central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the source archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = local_header_filename_size + local_header_extra_len + src_file_stat.m_comp_size;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_zip_array file_data_array;
        const mz_uint8 *pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE))
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_size, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64)
    {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size = cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) +
                                            pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the source archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)MZ_MAX(32U, MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining)
    {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8)
    {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6))
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else
        {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64)
            {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint32 *pSrc_descriptor = (const mz_uint32 *)((const mz_uint8 *)pBuf + (has_id ? sizeof(mz_uint32) : 0));
                const mz_uint32 src_crc32 = pSrc_descriptor[0];
                const mz_uint64 src_comp_size = pSrc_descriptor[1];
                const mz_uint64 src_uncomp_size = pSrc_descriptor[2];

                mz_write_le32((mz_uint8 *)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8 *)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else
            {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64)
    {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8 *pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block, pZip, pSrc_ext, src_ext_len, &src_file_stat.m_comp_size, &src_file_stat.m_uncomp_size, &local_dir_header_ofs, NULL))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_filename_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len + src_ext_len, src_comment_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else
    {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_central_dir_following_data_size))
        {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
    {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1))
    {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}